

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpptrace.cpp
# Opt level: O0

stacktrace * __thiscall
cpptrace::raw_trace::resolve(stacktrace *__return_storage_ptr__,raw_trace *this)

{
  bool bVar1;
  string local_80;
  reference local_60;
  stacktrace_frame *frame;
  iterator __end2;
  iterator __begin2;
  vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_> *__range2;
  undefined1 local_30 [8];
  vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_> trace;
  raw_trace *this_local;
  
  trace.super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  cpptrace::detail::resolve_frames
            ((vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_> *)
             local_30,&this->frames);
  __end2 = std::vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>::
           begin((vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_> *)
                 local_30);
  frame = (stacktrace_frame *)
          std::vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>::end
                    ((vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>
                      *)local_30);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<cpptrace::stacktrace_frame_*,_std::vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>_>
                                *)&frame);
    if (!bVar1) break;
    local_60 = __gnu_cxx::
               __normal_iterator<cpptrace::stacktrace_frame_*,_std::vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>_>
               ::operator*(&__end2);
    cpptrace::detail::demangle(&local_80,&local_60->symbol);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_60->symbol,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    __gnu_cxx::
    __normal_iterator<cpptrace::stacktrace_frame_*,_std::vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>_>
    ::operator++(&__end2);
  }
  std::vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>::vector
            (&__return_storage_ptr__->frames,
             (vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_> *)
             local_30);
  std::vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>::~vector
            ((vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_> *)
             local_30);
  return __return_storage_ptr__;
}

Assistant:

stacktrace raw_trace::resolve() const {
        try {
            std::vector<stacktrace_frame> trace = detail::resolve_frames(frames);
            for(auto& frame : trace) {
                frame.symbol = detail::demangle(frame.symbol);
            }
            return {std::move(trace)};
        } catch(...) { // NOSONAR
            if(!detail::should_absorb_trace_exceptions()) {
                throw;
            }
            return stacktrace{};
        }
    }